

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O0

void __thiscall
just::test::assert_equal_container::
run<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
          (assert_equal_container *this,vector<int,_std::allocator<int>_> *a_,
          vector<int,_std::allocator<int>_> *b_)

{
  bool v_;
  const_iterator b1_;
  const_iterator e1_;
  const_iterator b2_;
  const_iterator e2_;
  string local_1e8;
  int *local_1c8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_1c0;
  int *local_1b8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_1b0;
  ostringstream local_198 [8];
  ostringstream s;
  vector<int,_std::allocator<int>_> *b__local;
  vector<int,_std::allocator<int>_> *a__local;
  assert_equal_container *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::operator<<((ostream *)local_198,"Expected: ");
  local_1b0._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(a_);
  local_1b8 = (int *)std::vector<int,_std::allocator<int>_>::end(a_);
  show<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
            (local_1b0,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)local_1b8,
             (ostream *)local_198);
  std::operator<<((ostream *)local_198," == ");
  local_1c0._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(b_);
  local_1c8 = (int *)std::vector<int,_std::allocator<int>_>::end(b_);
  show<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
            (local_1c0,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)local_1c8,
             (ostream *)local_198);
  std::__cxx11::ostringstream::str();
  b1_ = std::vector<int,_std::allocator<int>_>::begin(a_);
  e1_ = std::vector<int,_std::allocator<int>_>::end(a_);
  b2_ = std::vector<int,_std::allocator<int>_>::begin(b_);
  e2_ = std::vector<int,_std::allocator<int>_>::end(b_);
  v_ = equal<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                 ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                  b1_._M_current,
                  (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                  e1_._M_current,
                  (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                  b2_._M_current,
                  (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                  e2_._M_current);
  assert_msg::operator()(&this->_assert_msg,&local_1e8,v_);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void run(const A& a_, const B& b_) const
      {
        std::ostringstream s;
        s << "Expected: ";
        show(a_.begin(), a_.end(), s);
        s << " == ";
        show(b_.begin(), b_.end(), s);

        _assert_msg(
          s.str(),
          ::just::test::equal(a_.begin(), a_.end(), b_.begin(), b_.end())
        );
      }